

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.cpp
# Opt level: O0

void TestSignalCopy(void)

{
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  __sighandler_t __handler_01;
  __sighandler_t __handler_02;
  __sighandler_t __handler_03;
  __sighandler_t __handler_04;
  int in_ESI;
  int __fd;
  uint __sig;
  undefined1 local_98 [8];
  signal<void_(int,_bool)> sg3;
  signal<void_(int,_bool)> sg2;
  connection local_68;
  anon_class_16_3_b23de825 local_50;
  undefined1 local_40 [8];
  function<void_(int,_bool)> receiver;
  undefined1 local_18 [2];
  bool receiverCalled;
  bool paramTwo;
  int paramOne;
  signal<void_(int,_bool)> sg;
  
  TestRunner::StartTest("TestSignalCopy");
  lsignal::signal<void_(int,_bool)>::signal((signal<void_(int,_bool)> *)local_18,in_ESI,__handler);
  receiver._M_invoker._4_4_ = 7;
  receiver._M_invoker._3_1_ = 1;
  receiver._M_invoker._2_1_ = 0;
  local_50.receiverCalled = (bool *)((long)&receiver._M_invoker + 2);
  local_50.paramOne = 7;
  local_50.paramTwo = true;
  std::function<void(int,bool)>::function<TestSignalCopy()::__0,void>
            ((function<void(int,bool)> *)local_40,&local_50);
  __fd = (int)(signal<void_(int,_bool)> *)local_18;
  lsignal::signal<void_(int,_bool)>::connect
            ((signal<void_(int,_bool)> *)&local_68,__fd,(sockaddr *)local_40,0);
  lsignal::connection::~connection(&local_68);
  lsignal::signal<void_(int,_bool)>::signal
            ((signal<void_(int,_bool)> *)
             &sg3._data.
              super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__fd,__handler_00);
  lsignal::signal<void_(int,_bool)>::operator=
            ((signal<void_(int,_bool)> *)
             &sg3._data.
              super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(signal<void_(int,_bool)> *)local_18);
  lsignal::signal<void_(int,_bool)>::operator()
            ((signal<void_(int,_bool)> *)
             &sg3._data.
              super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,receiver._M_invoker._4_4_,(bool)(receiver._M_invoker._3_1_ & 1));
  AssertHelper::VerifyValue
            (true,(bool)(receiver._M_invoker._2_1_ & 1),"Receiver2 should be called.");
  receiver._M_invoker._2_1_ = 0;
  lsignal::signal<void_(int,_bool)>::signal
            ((signal<void_(int,_bool)> *)local_98,(int)local_18,__handler_01);
  lsignal::signal<void_(int,_bool)>::operator()
            ((signal<void_(int,_bool)> *)local_98,receiver._M_invoker._4_4_,
             (bool)(receiver._M_invoker._3_1_ & 1));
  __sig = receiver._M_invoker._2_1_ & 1;
  AssertHelper::VerifyValue(true,SUB41(__sig,0),"Receiver3 should be called.");
  lsignal::signal<void_(int,_bool)>::~signal
            ((signal<void_(int,_bool)> *)local_98,__sig,__handler_02);
  lsignal::signal<void_(int,_bool)>::~signal
            ((signal<void_(int,_bool)> *)
             &sg3._data.
              super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__sig,__handler_03);
  std::function<void_(int,_bool)>::~function((function<void_(int,_bool)> *)local_40);
  lsignal::signal<void_(int,_bool)>::~signal
            ((signal<void_(int,_bool)> *)local_18,__sig,__handler_04);
  return;
}

Assistant:

void TestSignalCopy()
{
	TestRunner::StartTest(MethodName);

	lsignal::signal<void(int, bool)> sg;

	int paramOne = 7;
	bool paramTwo = true;

	bool receiverCalled = false;

	std::function<void(int, bool)> receiver = [=, &receiverCalled](int p0, bool p1)
	{
		receiverCalled = true;

		AssertHelper::VerifyValue(paramOne, p0, "First parameter should be as expected.");
		AssertHelper::VerifyValue(paramTwo, p1, "Second parameter should be as expected.");
	};

	sg.connect(receiver, nullptr);

	lsignal::signal<void(int, bool)> sg2;
	sg2 = sg;
	sg2(paramOne, paramTwo);

	AssertHelper::VerifyValue(true, receiverCalled, "Receiver2 should be called.");

	receiverCalled = false;
	lsignal::signal<void(int, bool)> sg3 = sg;
	sg3(paramOne, paramTwo);

	AssertHelper::VerifyValue(true, receiverCalled, "Receiver3 should be called.");
}